

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

basic_string_ref<char,_std::char_traits<char>_> *
cpsm::str_join<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *xs,string_ref sep)

{
  bool bVar1;
  reference puVar2;
  size_t in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  basic_string_ref<char,_std::char_traits<char>_> *in_RDI;
  unsigned_long *x;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  string_ref s;
  stringstream ss;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffdf8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe00;
  basic_string_ref<char,_std::char_traits<char>_> *os;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1c8;
  undefined8 local_1c0;
  basic_string_ref<char,_std::char_traits<char>_> local_1b8;
  stringstream local_1a8 [392];
  undefined8 local_20;
  char *local_18;
  size_t local_10;
  
  os = in_RDI;
  local_20 = in_RSI;
  local_18 = in_RDX;
  local_10 = in_RCX;
  std::__cxx11::stringstream::stringstream(local_1a8);
  boost::basic_string_ref<char,_std::char_traits<char>_>::basic_string_ref(&local_1b8);
  local_1c0 = local_20;
  local_1c8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffdf8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_fffffffffffffdf8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_1c8);
    in_stack_fffffffffffffe00 =
         boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)os,in_RDI);
    std::ostream::operator<<((ostream *)in_stack_fffffffffffffe00,*puVar2);
    local_1b8.ptr_ = local_18;
    local_1b8.len_ = local_10;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_1c8);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return os;
}

Assistant:

std::string str_join(T const& xs, boost::string_ref const sep) {
  std::stringstream ss;
  boost::string_ref s;
  for (auto const& x : xs) {
    ss << s << x;
    s = sep;
  }
  return ss.str();
}